

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int aec_decode_range(aec_stream_conflict *strm,size_t *rsi_offsets,size_t rsi_offsets_count,
                    size_t pos,size_t size)

{
  uint uVar1;
  internal_state_conflict *piVar2;
  int iVar3;
  uchar *__ptr;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  aec_stream_conflict *paVar8;
  size_t offset;
  aec_stream_conflict *paVar9;
  aec_stream_conflict aStack_78;
  
  piVar2 = strm->state;
  paVar8 = strm;
  paVar9 = &aStack_78;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    paVar9->next_in = paVar8->next_in;
    paVar8 = (aec_stream_conflict *)&paVar8->avail_in;
    paVar9 = (aec_stream_conflict *)((long)paVar9 + 8);
  }
  uVar1 = strm->block_size;
  uVar4 = (uint)(piVar2->pp != 0);
  piVar2->ref = uVar4;
  piVar2->encoded_block_size = uVar1 - uVar4;
  piVar2->rsip = piVar2->rsi_buffer;
  piVar2->flush_start = piVar2->rsi_buffer;
  piVar2->bitp = 0;
  piVar2->fs = 0;
  piVar2->mode = m_id;
  uVar4 = piVar2->bytes_per_sample;
  uVar6 = (ulong)(uVar4 * uVar1 * strm->rsi);
  if (pos / uVar6 < rsi_offsets_count) {
    aStack_78.total_out = 0;
    uVar7 = size + pos % uVar6 + 1;
    aStack_78.avail_out = ((ulong)uVar4 - uVar7 % (ulong)uVar4) + uVar7;
    __ptr = (uchar *)malloc(aStack_78.avail_out);
    if (__ptr == (uchar *)0x0) {
      iVar3 = -4;
    }
    else {
      offset = rsi_offsets[pos / uVar6];
      aStack_78.next_out = __ptr;
      iVar3 = aec_buffer_seek(&aStack_78,offset);
      if ((iVar3 == 0) && (iVar3 = aec_decode(&aStack_78,(int)offset), iVar3 == 0)) {
        memcpy(strm->next_out,__ptr + pos % uVar6,size);
        strm->next_out = strm->next_out + size;
        strm->avail_out = strm->avail_out - size;
        strm->total_out = strm->total_out + size;
        free(__ptr);
        iVar3 = 0;
      }
    }
  }
  else {
    iVar3 = -3;
  }
  return iVar3;
}

Assistant:

int aec_decode_range(struct aec_stream *strm, const size_t *rsi_offsets, size_t rsi_offsets_count, size_t pos, size_t size)
{
    struct internal_state *state = strm->state;
    int status;
    size_t rsi_size;
    size_t rsi_n;
    unsigned char *out_tmp;
    struct aec_stream strm_tmp = *strm;

    if (state->pp) {
        state->ref = 1;
        state->encoded_block_size = strm->block_size - 1;
    } else {
        state->ref = 0;
        state->encoded_block_size = strm->block_size;
    }

    state->rsip = state->rsi_buffer;
    state->flush_start = state->rsi_buffer;
    state->bitp = 0;
    state->fs = 0;
    state->mode = m_id;

    rsi_size = strm->rsi * strm->block_size * state->bytes_per_sample;
    rsi_n = pos / rsi_size;
    if (rsi_n >= rsi_offsets_count)
        return AEC_DATA_ERROR;

    /* resize and align to bytes_per_sample */
    strm_tmp.total_out = 0;
    strm_tmp.avail_out = size + pos % rsi_size + 1;
    strm_tmp.avail_out += state->bytes_per_sample - strm_tmp.avail_out % state->bytes_per_sample;
    if ((out_tmp = malloc(strm_tmp.avail_out)) == NULL)
        return AEC_MEM_ERROR;
    strm_tmp.next_out = out_tmp;

    if ((status = aec_buffer_seek(&strm_tmp, rsi_offsets[rsi_n])) != AEC_OK)
        return status;

    if ((status = aec_decode(&strm_tmp, AEC_FLUSH)) != 0)
        return status;

    memcpy(strm->next_out, out_tmp + (pos - rsi_n * rsi_size), size);

    strm->next_out += size;
    strm->avail_out -= size;
    strm->total_out += size;
    free(out_tmp);

    return AEC_OK;
}